

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_handler.c
# Opt level: O1

soHandle_t lh_load_lib(char *libName)

{
  soHandle_t pvVar1;
  undefined8 uVar2;
  
  if (libName == (char *)0x0) {
    printf("ERROR in %s: ","lh_load_lib");
    printf("no library name given");
  }
  else {
    pvVar1 = (soHandle_t)dlopen(libName,1);
    if (pvVar1 != (soHandle_t)0x0) {
      return pvVar1;
    }
    printf("ERROR in %s: ","lh_load_lib");
    uVar2 = dlerror();
    printf("Error while loading dynamic library %s: %s",libName,uVar2);
  }
  putchar(10);
  return (soHandle_t)0x0;
}

Assistant:

soHandle_t lh_load_lib(const char *libName) {
    soHandle_t h = OSQP_NULL;

    if (!libName) {
        #ifdef PRINTING
        c_eprint("no library name given");
        #endif
        return OSQP_NULL;
    }

#ifdef IS_WINDOWS
    h = LoadLibrary (libName);
    if (!h) {
        #ifdef PRINTING
        c_eprint("Windows error while loading dynamic library %s, error = %d",
                libName, (int)GetLastError());
        #endif
    }
#else
    h = dlopen (libName, RTLD_LAZY);
    if (!h) {
        #ifdef PRINTING
        c_eprint("Error while loading dynamic library %s: %s", libName, dlerror());
        #endif
    }
#endif

    return h;
}